

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_font_x.cxx
# Opt level: O0

void __thiscall
Fl_Xlib_Graphics_Driver::text_extents
          (Fl_Xlib_Graphics_Driver *this,char *c,int n,int *dx,int *dy,int *W,int *H)

{
  Display *pDVar1;
  Window d;
  GC p_Var2;
  Fl_Font_Descriptor *pFVar3;
  int local_50;
  int local_4c;
  int hh;
  int ww;
  int yy;
  int xx;
  int *W_local;
  int *dy_local;
  int *dx_local;
  char *pcStack_20;
  int n_local;
  char *c_local;
  Fl_Xlib_Graphics_Driver *this_local;
  
  _yy = W;
  W_local = dy;
  dy_local = dx;
  dx_local._4_4_ = n;
  pcStack_20 = c;
  c_local = (char *)this;
  if (font_gc != fl_gc) {
    pFVar3 = Fl_Graphics_Driver::font_descriptor(&this->super_Fl_Graphics_Driver);
    if (pFVar3 == (Fl_Font_Descriptor *)0x0) {
      (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x36])
                (this,0,(ulong)(uint)FL_NORMAL_SIZE);
    }
    p_Var2 = fl_gc;
    pDVar1 = fl_display;
    font_gc = fl_gc;
    pFVar3 = Fl_Graphics_Driver::font_descriptor(&this->super_Fl_Graphics_Driver);
    XSetFont(pDVar1,p_Var2,pFVar3->font->fid);
  }
  d = fl_window;
  pDVar1 = fl_display;
  local_50 = 0;
  local_4c = 0;
  hh = 0;
  ww = 0;
  if (fl_gc != (GC)0x0) {
    pFVar3 = Fl_Graphics_Driver::font_descriptor(&this->super_Fl_Graphics_Driver);
    XUtf8_measure_extents
              (pDVar1,d,pFVar3->font,fl_gc,&ww,&hh,&local_4c,&local_50,pcStack_20,dx_local._4_4_);
  }
  *_yy = local_4c;
  *H = local_50;
  *dy_local = ww;
  *W_local = hh;
  return;
}

Assistant:

void Fl_Xlib_Graphics_Driver::text_extents(const char *c, int n, int &dx, int &dy, int &W, int &H) {
  if (font_gc != fl_gc) {
    if (!font_descriptor()) font(FL_HELVETICA, FL_NORMAL_SIZE);
    font_gc = fl_gc;
    XSetFont(fl_display, fl_gc, font_descriptor()->font->fid);
  }
  int xx, yy, ww, hh;
  xx = yy = ww = hh = 0;
  if (fl_gc) XUtf8_measure_extents(fl_display, fl_window, font_descriptor()->font, fl_gc, &xx, &yy, &ww, &hh, c, n);

  W = ww; H = hh; dx = xx; dy = yy;
// This is the safe but mostly wrong thing we used to do...
//  W = 0; H = 0;
//  fl_measure(c, W, H, 0);
//  dx = 0;
//  dy = fl_descent() - H;
}